

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CoverageBinsArraySizeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverageBinsArraySizeSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,ExpressionSyntax **args_1,Token *args_2)

{
  Token closeBracket;
  Token openBracket;
  CoverageBinsArraySizeSyntax *expr;
  Info *in_RCX;
  undefined8 *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  expr = (CoverageBinsArraySizeSyntax *)
         allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  openBracket.info = in_RCX;
  openBracket._0_8_ = in_RSI[1];
  closeBracket.info = (Info *)*in_RSI;
  closeBracket._0_8_ = in_RCX->location;
  slang::syntax::CoverageBinsArraySizeSyntax::CoverageBinsArraySizeSyntax
            ((CoverageBinsArraySizeSyntax *)in_RCX->rawTextPtr,openBracket,(ExpressionSyntax *)expr,
             closeBracket);
  return expr;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }